

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::InitializeFromCommand(cmCTest *this,cmCTestStartCommand *command)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  string local_278;
  string fname;
  string bld_dir;
  string bld_dir_fname;
  string src_dir_fname;
  string local_1d8;
  string src_dir;
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"SourceDirectory",(allocator<char> *)&bld_dir);
  GetCTestConfiguration(&src_dir,this,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"BuildDirectory",(allocator<char> *)&fname);
  GetCTestConfiguration(&bld_dir,this,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::assign
            ((char *)&((this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->BuildID);
  for (lVar4 = 0x3728; lVar4 != 0x3a28; lVar4 = lVar4 + 0x40) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&((this->Impl)._M_t.
                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                        .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatCount
               + lVar4));
  }
  this_00 = (command->super_cmCTestCommand).super_cmCommand.Makefile;
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  cmStrCat<std::__cxx11::string&,char_const(&)[19]>
            (&src_dir_fname,&src_dir,(char (*) [19])"/CTestConfig.cmake");
  cmsys::SystemTools::ConvertToUnixSlashes(&src_dir_fname);
  cmStrCat<std::__cxx11::string&,char_const(&)[19]>
            (&bld_dir_fname,&bld_dir,(char (*) [19])"/CTestConfig.cmake");
  cmsys::SystemTools::ConvertToUnixSlashes(&bld_dir_fname);
  bVar1 = cmsys::SystemTools::FileExists(&bld_dir_fname);
  if (bVar1) {
LAB_0018821a:
    std::__cxx11::string::_M_assign((string *)&fname);
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(&src_dir_fname);
    if (bVar1) goto LAB_0018821a;
  }
  if (fname._M_string_length == 0) {
LAB_001882c6:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"CTEST_NIGHTLY_START_TIME",(allocator<char> *)&local_278);
    SetCTestConfigurationFromCMakeVariable
              (this,this_00,"NightlyStartTime",(string *)&cmCTestLog_msg,command->Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"CTEST_SITE",(allocator<char> *)&local_278);
    SetCTestConfigurationFromCMakeVariable
              (this,this_00,"Site",(string *)&cmCTestLog_msg,command->Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"CTEST_BUILD_NAME",(allocator<char> *)&local_278);
    SetCTestConfigurationFromCMakeVariable
              (this,this_00,"BuildName",(string *)&cmCTestLog_msg,command->Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    iVar2 = Initialize(this,&bld_dir,command);
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   Use ");
      GetTestModelString_abi_cxx11_(&local_278,this);
      poVar3 = std::operator<<(poVar3,(string *)&local_278);
      poVar3 = std::operator<<(poVar3," tag: ");
      GetCurrentTag_abi_cxx11_(&local_1d8,this);
      poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0x2bd,local_278._M_dataplus._M_p,command->Quiet);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      bVar1 = true;
      goto LAB_001884b1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   Reading ctest configuration file: ");
    poVar3 = std::operator<<(poVar3,(string *)&fname);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x2a6,local_278._M_dataplus._M_p,command->Quiet);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar1 = cmMakefile::ReadDependentFile(this_00,&fname,true);
    if (bVar1) goto LAB_001882c6;
    cmStrCat<char_const(&)[30],std::__cxx11::string&>
              ((string *)&cmCTestLog_msg,(char (*) [30])"Could not find include file: ",&fname);
    cmCommand::SetError((cmCommand *)command,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  bVar1 = false;
LAB_001884b1:
  std::__cxx11::string::~string((string *)&bld_dir_fname);
  std::__cxx11::string::~string((string *)&src_dir_fname);
  std::__cxx11::string::~string((string *)&fname);
  std::__cxx11::string::~string((string *)&bld_dir);
  std::__cxx11::string::~string((string *)&src_dir);
  return bVar1;
}

Assistant:

bool cmCTest::InitializeFromCommand(cmCTestStartCommand* command)
{
  std::string src_dir = this->GetCTestConfiguration("SourceDirectory");
  std::string bld_dir = this->GetCTestConfiguration("BuildDirectory");
  this->Impl->BuildID = "";
  for (Part p = PartStart; p != PartCount; p = static_cast<Part>(p + 1)) {
    this->Impl->Parts[p].SubmitFiles.clear();
  }

  cmMakefile* mf = command->GetMakefile();
  std::string fname;

  std::string src_dir_fname = cmStrCat(src_dir, "/CTestConfig.cmake");
  cmSystemTools::ConvertToUnixSlashes(src_dir_fname);

  std::string bld_dir_fname = cmStrCat(bld_dir, "/CTestConfig.cmake");
  cmSystemTools::ConvertToUnixSlashes(bld_dir_fname);

  if (cmSystemTools::FileExists(bld_dir_fname)) {
    fname = bld_dir_fname;
  } else if (cmSystemTools::FileExists(src_dir_fname)) {
    fname = src_dir_fname;
  }

  if (!fname.empty()) {
    cmCTestOptionalLog(this, OUTPUT,
                       "   Reading ctest configuration file: " << fname
                                                               << std::endl,
                       command->ShouldBeQuiet());
    bool readit = mf->ReadDependentFile(fname);
    if (!readit) {
      std::string m = cmStrCat("Could not find include file: ", fname);
      command->SetError(m);
      return false;
    }
  }

  this->SetCTestConfigurationFromCMakeVariable(mf, "NightlyStartTime",
                                               "CTEST_NIGHTLY_START_TIME",
                                               command->ShouldBeQuiet());
  this->SetCTestConfigurationFromCMakeVariable(mf, "Site", "CTEST_SITE",
                                               command->ShouldBeQuiet());
  this->SetCTestConfigurationFromCMakeVariable(
    mf, "BuildName", "CTEST_BUILD_NAME", command->ShouldBeQuiet());

  if (!this->Initialize(bld_dir, command)) {
    return false;
  }
  cmCTestOptionalLog(this, OUTPUT,
                     "   Use " << this->GetTestModelString() << " tag: "
                               << this->GetCurrentTag() << std::endl,
                     command->ShouldBeQuiet());
  return true;
}